

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O3

void Min_EsopMinimize(Min_Man_t *p)

{
  Min_Cube_t **ppMVar1;
  int iVar2;
  Min_Cube_t *pMVar3;
  sbyte sVar4;
  sbyte sVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  Min_Cube_t *pMVar9;
  Min_Cube_t *pCube1;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  Min_Cube_t *pMVar14;
  int Var0;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  long local_40;
  long local_38;
  
  iVar2 = p->nCubes;
  if (iVar2 < 3) {
    return;
  }
  pMVar3 = p->pBubble;
LAB_003bbdf9:
  ppMVar1 = p->ppStore;
  pMVar3->pNext = *ppMVar1;
  *ppMVar1 = pMVar3;
  *(uint *)&pMVar3->field_0x8 = *(uint *)&pMVar3->field_0x8 & 0x3fffff;
  local_6c = iVar2;
LAB_003bbe11:
  do {
    pMVar3 = p->pBubble;
    uVar10 = *(uint *)&pMVar3->field_0x8 >> 0x16;
    uVar13 = (ulong)uVar10;
    pMVar9 = (Min_Cube_t *)((ulong)(uVar10 * 8) + (long)p->ppStore);
    do {
      pMVar14 = pMVar9;
      pMVar9 = pMVar14->pNext;
      if (pMVar9 == (Min_Cube_t *)0x0) break;
    } while (pMVar9 != pMVar3);
    if (pMVar9 != pMVar3) {
      __assert_fail("pCube == p->pBubble",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                    ,0x65,"void Min_EsopRewrite(Min_Man_t *)");
    }
    pMVar14->pNext = pMVar3->pNext;
    pMVar3 = p->pBubble;
    pMVar9 = pMVar3->pNext;
    pCube1 = pMVar9;
    if (pMVar9 == (Min_Cube_t *)0x0) {
      uVar6 = uVar13;
      if ((int)uVar10 < p->nVars) {
        uVar6 = (ulong)(uint)p->nVars;
      }
      lVar8 = -(ulong)(uVar10 * 8);
      do {
        if (uVar6 == uVar13) {
          iVar2 = p->nCubes;
          if (((double)(local_6c - iVar2) * 100.0) / (double)local_6c <= 3.0) {
            return;
          }
          goto LAB_003bbdf9;
        }
        pMVar9 = p->ppStore[uVar13 + 1];
        uVar13 = uVar13 + 1;
        lVar8 = lVar8 + -8;
      } while (pMVar9 == (Min_Cube_t *)0x0);
      pMVar14 = (Min_Cube_t *)((long)p->ppStore - lVar8);
      pCube1 = pMVar9;
    }
    do {
      pMVar3 = pCube1;
      pCube1 = pMVar3->pNext;
      if (pCube1 == (Min_Cube_t *)0x0) {
        iVar2 = p->nVars;
        iVar11 = (int)uVar13;
        if (iVar2 <= iVar11) goto LAB_003bbef7;
        pCube1 = (Min_Cube_t *)(p->ppStore + (long)iVar11 + 1);
        goto LAB_003bbece;
      }
      iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&local_70,&local_74);
    } while (iVar2 == 0);
LAB_003bbf3a:
    pMVar3->pNext = pCube1->pNext;
    pMVar3 = p->pBubble;
    pMVar14->pNext = pMVar3;
    pMVar3->pNext = pMVar9->pNext;
    *(uint *)&pMVar3->field_0x8 =
         *(uint *)&pMVar3->field_0x8 & 0x3fffff | *(uint *)&pMVar9->field_0x8 & 0xffc00000;
    p->nCubes = p->nCubes + -2;
    local_38 = (long)(local_70 >> 4);
    local_44 = local_70 * 2 & 0x1e;
    sVar4 = (sbyte)local_44;
    local_40 = (long)(local_74 >> 4);
    local_54 = local_74 * 2 & 0x1e;
    sVar5 = (sbyte)local_54;
    local_48 = pMVar9->uData[local_38] >> sVar4 & 3;
    local_50 = pMVar9->uData[local_40] >> sVar5 & 3;
    local_4c = pCube1->uData[local_38] >> sVar4 & 3;
    uVar10 = pCube1->uData[local_40] >> sVar5 & 3;
    local_64 = local_4c << sVar4;
    pMVar9->uData[local_38] = pMVar9->uData[local_38] ^ local_64;
    local_68 = local_4c ^ local_48;
    local_58 = (uint)(local_68 != 3) * 0x400000;
    local_5c = local_50 << sVar5;
    *(uint *)&pMVar9->field_0x8 =
         *(uint *)&pMVar9->field_0x8 & 0x3fffff |
         ((uint)(local_48 == 3) * 0x400000 + *(uint *)&pMVar9->field_0x8 + local_58) - 0x400000 &
         0xffc00000;
    pCube1->uData[local_40] = pCube1->uData[local_40] ^ local_5c;
    local_60 = (uint)((uVar10 ^ local_50) != 3);
    iVar12 = local_60 * 0x400000;
    *(uint *)&pCube1->field_0x8 =
         (uint)(uVar10 == 3) * 0x400000 + iVar12 + *(int *)&pCube1->field_0x8 + -0x400000;
    iVar2 = p->nCubes;
    Min_EsopAddCube(p,pMVar9);
    Min_EsopAddCube(p,pCube1);
    iVar11 = p->nCubes;
    if (iVar2 + 2 <= iVar11) {
      uVar7 = *(uint *)&pCube1->field_0x8 >> 0x16;
      if (pCube1 != p->ppStore[uVar7]) {
        __assert_fail("pThis == p->ppStore[pThis->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                      ,0xb3,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar7] = pCube1->pNext;
      uVar7 = *(uint *)&pMVar9->field_0x8 >> 0x16;
      if (pMVar9 != p->ppStore[uVar7]) {
        __assert_fail("pCube == p->ppStore[pCube->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covMinEsop.c"
                      ,0xb5,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar7] = pMVar9->pNext;
      p->nCubes = iVar11 + -2;
      pMVar9->uData[local_38] = pMVar9->uData[local_38] ^ local_64;
      *(uint *)&pMVar9->field_0x8 =
           *(int *)&pMVar9->field_0x8 +
           (uint)(local_48 != 3) * 0x400000 + (uint)(local_68 == 3) * 0x400000 + -0x400000;
      pMVar9->uData[local_40] = pMVar9->uData[local_40] ^ uVar10 << ((byte)local_54 & 0x1f);
      *(uint *)&pMVar9->field_0x8 =
           *(int *)&pMVar9->field_0x8 + iVar12 + (uint)(local_50 != 3) * -0x400000;
      pCube1->uData[local_38] = pCube1->uData[local_38] ^ local_48 << ((byte)local_44 & 0x1f);
      *(uint *)&pCube1->field_0x8 =
           *(int *)&pCube1->field_0x8 + local_58 + (uint)(local_4c != 3) * -0x400000;
      pCube1->uData[local_40] = pCube1->uData[local_40] ^ local_5c;
      *(uint *)&pCube1->field_0x8 =
           *(int *)&pCube1->field_0x8 + (uint)(uVar10 != 3) * 0x400000 + local_60 * -0x400000;
      Min_EsopAddCube(p,pMVar9);
      Min_EsopAddCube(p,pCube1);
    }
  } while( true );
LAB_003bbece:
  pMVar3 = pCube1;
  pCube1 = pMVar3->pNext;
  if (pCube1 != (Min_Cube_t *)0x0) goto code_r0x003bbeda;
  iVar2 = p->nVars;
LAB_003bbef7:
  if (iVar11 < iVar2 + -1) {
    pCube1 = (Min_Cube_t *)(p->ppStore + (long)iVar11 + 2);
    do {
      pMVar3 = pCube1;
      pCube1 = pMVar3->pNext;
      if (pCube1 == (Min_Cube_t *)0x0) goto LAB_003bc1c8;
      iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&local_70,&local_74);
    } while (iVar2 == 0);
    goto LAB_003bbf3a;
  }
LAB_003bc1c8:
  pMVar3 = p->pBubble;
  pMVar3->pNext = pMVar9->pNext;
  pMVar9->pNext = pMVar3;
  *(uint *)&pMVar3->field_0x8 =
       *(uint *)&pMVar3->field_0x8 & 0x3fffff | *(uint *)&pMVar9->field_0x8 & 0xffc00000;
  goto LAB_003bbe11;
code_r0x003bbeda:
  iVar2 = Min_CubesDistTwo(pMVar9,pCube1,&local_70,&local_74);
  if (iVar2 != 0) goto LAB_003bbf3a;
  goto LAB_003bbece;
}

Assistant:

void Min_EsopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_EsopRewrite( p );
        nIter++;
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );

//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
}